

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O2

void __thiscall
so_5::impl::adaptive_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  _Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
  _Var1;
  
  _Var1.super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl =
       (&this->m_small_storage)
       [this->m_threshold <
        (ulong)((long)(info->
                      super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(info->
                      super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 6)]._M_t.
       super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
       .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>;
  (**(code **)(*(long *)_Var1.super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>.
                        _M_head_impl + 0x48))
            (_Var1.super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl);
  this->m_current_storage =
       (subscription_storage_t *)
       _Var1.super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl;
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		auto s = info.size() <= m_threshold ?
				m_small_storage.get() : m_large_storage.get();

		s->setup_content( std::move( info ) );

		m_current_storage = s;
	}